

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOdc.c
# Opt level: O1

uint Abc_NtkDontCareCofactors_rec(Odc_Man_t *p,Odc_Lit_t Lit,uint uMask)

{
  Odc_Obj_t *pOVar1;
  ushort uVar2;
  Odc_Lit_t OVar3;
  Odc_Lit_t OVar4;
  uint uVar5;
  uint uVar6;
  
  if ((Lit & 1) != 0) {
    __assert_fail("!Odc_IsComplement(Lit)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcOdc.c"
                  ,0x2e7,
                  "unsigned int Abc_NtkDontCareCofactors_rec(Odc_Man_t *, Odc_Lit_t, unsigned int)")
    ;
  }
  uVar5 = (uint)Lit;
  uVar2 = Lit >> 1;
  if ((int)(uint)uVar2 < p->nObjs) {
    pOVar1 = p->pObjs + uVar2;
    if (p->pObjs[uVar2].TravId == p->nTravIds) {
      uVar6 = pOVar1->uData;
    }
    else {
      pOVar1->TravId = p->nTravIds;
      if ((pOVar1->uMask & uMask) == 0) {
        uVar6 = uVar5 << 0x10;
      }
      else {
        if ((pOVar1->uMask == uMask) && ((int)(uint)uVar2 <= p->nPis)) {
          pOVar1->uData = 1;
          return 1;
        }
        uVar5 = Abc_NtkDontCareCofactors_rec(p,pOVar1->iFan0 & 0xfffe,uMask);
        uVar6 = Abc_NtkDontCareCofactors_rec(p,pOVar1->iFan1 & 0xfffe,uMask);
        OVar3 = Odc_And(p,pOVar1->iFan0 & 1 ^ (ushort)uVar5,pOVar1->iFan1 & 1 ^ (ushort)uVar6);
        OVar4 = Odc_And(p,pOVar1->iFan0 & 1 ^ (ushort)(uVar5 >> 0x10),
                        pOVar1->iFan1 & 1 ^ (ushort)(uVar6 >> 0x10));
        uVar5 = (uint)OVar4 << 0x10;
        uVar6 = (uint)OVar3;
      }
      uVar6 = uVar6 | uVar5;
      pOVar1->uData = uVar6;
    }
    return uVar6;
  }
  __assert_fail("!(Lit & 1) && (int)(Lit>>1) < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcOdc.c"
                ,0x79,"Odc_Obj_t *Odc_Lit2Obj(Odc_Man_t *, Odc_Lit_t)");
}

Assistant:

unsigned Abc_NtkDontCareCofactors_rec( Odc_Man_t * p, Odc_Lit_t Lit, unsigned uMask )
{
    Odc_Obj_t * pObj;
    unsigned uData0, uData1;
    Odc_Lit_t uLit0, uLit1, uRes0, uRes1;
    assert( !Odc_IsComplement(Lit) );
    // skip visited objects
    pObj = Odc_Lit2Obj( p, Lit );
    if ( Odc_ObjIsTravIdCurrent(p, pObj) )
        return pObj->uData;
    Odc_ObjSetTravIdCurrent(p, pObj);
    // skip objects out of the cone
    if ( (pObj->uMask & uMask) == 0 )
        return pObj->uData = ((Lit << 16) | Lit);
    // consider the case when the node is the var
    if ( pObj->uMask == uMask && Odc_IsTerm(p, Lit) )
        return pObj->uData = ((Odc_Const1() << 16) | Odc_Const0());
    // compute the cofactors
    uData0 = Abc_NtkDontCareCofactors_rec( p, Odc_ObjFanin0(pObj), uMask );
    uData1 = Abc_NtkDontCareCofactors_rec( p, Odc_ObjFanin1(pObj), uMask );
    // find the 0-cofactor
    uLit0 = Odc_NotCond( (Odc_Lit_t)(uData0 & 0xffff), Odc_ObjFaninC0(pObj) );
    uLit1 = Odc_NotCond( (Odc_Lit_t)(uData1 & 0xffff), Odc_ObjFaninC1(pObj) );
    uRes0 = Odc_And( p, uLit0, uLit1 );
    // find the 1-cofactor
    uLit0 = Odc_NotCond( (Odc_Lit_t)(uData0 >> 16), Odc_ObjFaninC0(pObj) );
    uLit1 = Odc_NotCond( (Odc_Lit_t)(uData1 >> 16), Odc_ObjFaninC1(pObj) );
    uRes1 = Odc_And( p, uLit0, uLit1 );
    // find the result
    return pObj->uData = ((uRes1 << 16) | uRes0);
}